

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luma_quantizer.cpp
# Opt level: O0

void __thiscall LumaQuantizer::setMappingPsi(LumaQuantizer *this)

{
  ulong local_20;
  size_t i;
  float *mapping;
  LumaQuantizer *this_local;
  
  if (this->m_bitdepth == 10) {
    i = (size_t)ptf_jnd_ferwerda_10bit;
  }
  else if (this->m_bitdepth == 0xb) {
    i = (size_t)ptf_jnd_ferwerda_11bit;
  }
  else {
    i = (size_t)ptf_jnd_ferwerda_12bit;
  }
  for (local_20 = 0; local_20 <= this->m_maxVal; local_20 = local_20 + 1) {
    this->m_mapping[local_20] = *(float *)(i + local_20 * 4);
  }
  return;
}

Assistant:

void LumaQuantizer::setMappingPsi()
{
    const float *mapping;
    switch (m_bitdepth)
    {
    case 10:
        mapping = ptf_jnd_ferwerda_10bit;
        break;
    case 11:
        mapping = ptf_jnd_ferwerda_11bit;
        break;
    case 12:
    default:
        mapping = ptf_jnd_ferwerda_12bit;
        break;
    }
    
    for (size_t i=0; i<=m_maxVal; i++)
        m_mapping[i] = mapping[i];
}